

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_trace_v2(sqlite3 *db,uint mTrace,_func_int_uint_void_ptr_void_ptr_void_ptr *xTrace,
                    void *pArg)

{
  void *pArg_local;
  _func_int_uint_void_ptr_void_ptr_void_ptr *xTrace_local;
  uint mTrace_local;
  sqlite3 *db_local;
  
  sqlite3_mutex_enter(db->mutex);
  pArg_local = xTrace;
  if (mTrace == 0) {
    pArg_local = (void *)0x0;
  }
  xTrace_local._4_4_ = mTrace;
  if (pArg_local == (void *)0x0) {
    xTrace_local._4_4_ = 0;
  }
  db->mTrace = (u8)xTrace_local._4_4_;
  (db->trace).xLegacy = (_func_void_void_ptr_char_ptr *)pArg_local;
  db->pTraceArg = pArg;
  sqlite3_mutex_leave(db->mutex);
  return 0;
}

Assistant:

SQLITE_API int sqlite3_trace_v2(
  sqlite3 *db,                               /* Trace this connection */
  unsigned mTrace,                           /* Mask of events to be traced */
  int(*xTrace)(unsigned,void*,void*,void*),  /* Callback to invoke */
  void *pArg                                 /* Context */
){
#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(db) ){
    return SQLITE_MISUSE_BKPT;
  }
#endif
  sqlite3_mutex_enter(db->mutex);
  if( mTrace==0 ) xTrace = 0;
  if( xTrace==0 ) mTrace = 0;
  db->mTrace = mTrace;
  db->trace.xV2 = xTrace;
  db->pTraceArg = pArg;
  sqlite3_mutex_leave(db->mutex);
  return SQLITE_OK;
}